

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_open_fp(mtar_t *tar,void *fp)

{
  void *fp_local;
  mtar_t *tar_local;
  
  memset(tar,0,0x60);
  if (fp == (void *)0x0) {
    tar_local._4_4_ = -2;
  }
  else {
    tar->write = mtar_file_write;
    tar->read = mtar_file_read;
    tar->seek = mtar_file_seek;
    tar->close = mtar_file_close;
    tar->stream = fp;
    tar_local._4_4_ = 0;
  }
  return tar_local._4_4_;
}

Assistant:

int mtar_open_fp(mtar_t *tar, void *fp) {
  /* Init tar struct and functions */
  memset(tar, 0, sizeof(*tar));
  if (!fp) return MTAR_EOPENFAIL;

  tar->write = mtar_file_write;
  tar->read = mtar_file_read;
  tar->seek = mtar_file_seek;
  tar->close = mtar_file_close;
  tar->stream = fp;

  /* Return ok */
  return MTAR_ESUCCESS;
}